

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::UStringEnumeration::snext(UStringEnumeration *this,UErrorCode *status)

{
  short sVar1;
  undefined8 in_RAX;
  UChar *srcChars;
  UnicodeString *pUVar2;
  int32_t length_00;
  int32_t length;
  int32_t local_24;
  
  local_24 = (int32_t)((ulong)in_RAX >> 0x20);
  srcChars = uenum_unext_63(this->uenum,&local_24,status);
  pUVar2 = (UnicodeString *)0x0;
  if ((srcChars != (UChar *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    pUVar2 = &(this->super_StringEnumeration).unistr;
    UnicodeString::unBogus(pUVar2);
    sVar1 = (this->super_StringEnumeration).unistr.fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      length_00 = (this->super_StringEnumeration).unistr.fUnion.fFields.fLength;
    }
    else {
      length_00 = (int)sVar1 >> 5;
    }
    pUVar2 = UnicodeString::doReplace(pUVar2,0,length_00,srcChars,0,local_24);
  }
  return pUVar2;
}

Assistant:

const UnicodeString* UStringEnumeration::snext(UErrorCode& status) {
    int32_t length;
    const UChar* str = uenum_unext(uenum, &length, &status);
    if (str == 0 || U_FAILURE(status)) {
        return 0;
    }
    return &unistr.setTo(str, length);
}